

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int selectExpander(Walker *pWalker,Select *p)

{
  Table **ppTVar1;
  undefined1 *puVar2;
  u8 uVar3;
  byte bVar4;
  char cVar5;
  ushort uVar6;
  Parse *pParse;
  sqlite3 *db;
  SrcList *pList;
  ExprList *pList_00;
  SrcList *pSrc;
  ExprList_item *pEVar7;
  Column *pCVar8;
  int iVar9;
  int iVar10;
  Table *pTVar11;
  Select *pSVar12;
  Expr **ppWhere;
  ulong uVar13;
  byte *zTab;
  ulong uVar14;
  Expr *pEVar15;
  Expr *pEVar16;
  char *pcVar17;
  char *pcVar18;
  uint uVar19;
  char *z2;
  byte *pbVar20;
  char *pcVar21;
  long lVar22;
  ExprList_item *pEVar23;
  byte *pbVar24;
  char *pcVar25;
  Table **ppTVar26;
  ExprList_item *pEVar27;
  long lVar28;
  Schema **ppSVar29;
  long lVar30;
  SrcList_item *pSVar31;
  int iVar32;
  SrcList *pSVar33;
  long lVar34;
  long lVar35;
  Select *pSVar36;
  int i;
  bool bVar37;
  bool bVar38;
  ExprList *local_e0;
  int local_cc;
  uint local_c8;
  byte *local_b0;
  int local_94;
  ulong local_58;
  Token sColname;
  
  pParse = pWalker->pParse;
  db = pParse->db;
  uVar6 = p->selFlags;
  p->selFlags = uVar6 | 0x10;
  if (db->mallocFailed == '\0') {
    pList = p->pSrc;
    iVar10 = 1;
    if ((uVar6 & 0x10) != 0 || pList == (SrcList *)0x0) {
      return 1;
    }
    pList_00 = p->pEList;
    sqlite3SrcListAssignCursors(pParse,pList);
    if (0 < pList->nSrc) {
      iVar32 = 0;
      pSVar31 = pList->a;
      do {
        if (pSVar31->pTab == (Table *)0x0) {
          if (pSVar31->zName == (char *)0x0) {
            pSVar12 = pSVar31->pSelect;
            sqlite3WalkSelect(pWalker,pSVar12);
            pTVar11 = (Table *)sqlite3DbMallocRaw(db,0x78);
            if (pTVar11 == (Table *)0x0) {
              pSVar31->pTab = (Table *)0x0;
              iVar10 = 2;
            }
            else {
              pTVar11->pTrigger = (Trigger *)0x0;
              pTVar11->pSchema = (Schema *)0x0;
              pTVar11->azModuleArg = (char **)0x0;
              pTVar11->pVTable = (VTable *)0x0;
              pTVar11->iPKey = 0;
              pTVar11->nCol = 0;
              pTVar11->nRef = 0;
              pTVar11->tabFlags = '\0';
              pTVar11->keyConf = '\0';
              pTVar11->addColOffset = 0;
              pTVar11->nModuleArg = 0;
              pTVar11->pCheck = (ExprList *)0x0;
              pTVar11->nRowEst = 0;
              pTVar11->tnum = 0;
              pTVar11->pFKey = (FKey *)0x0;
              pTVar11->zColAff = (char *)0x0;
              pTVar11->pIndex = (Index *)0x0;
              pTVar11->pSelect = (Select *)0x0;
              pTVar11->zName = (char *)0x0;
              pTVar11->aCol = (Column *)0x0;
              pTVar11->pNextZombie = (Table *)0x0;
              pSVar31->pTab = pTVar11;
              pTVar11->nRef = 1;
              pcVar25 = sqlite3MPrintf(db,"sqlite_subquery_%p_",pTVar11);
              pTVar11->zName = pcVar25;
              do {
                pSVar36 = pSVar12;
                pSVar12 = pSVar36->pPrior;
              } while (pSVar12 != (Select *)0x0);
              selectColumnsFromExprList(pParse,pSVar36->pEList,&pTVar11->nCol,&pTVar11->aCol);
              pTVar11->iPKey = -1;
              pTVar11->nRowEst = 1000000;
              pTVar11->tabFlags = pTVar11->tabFlags | 2;
            }
            if (pTVar11 != (Table *)0x0) goto LAB_0015b671;
          }
          else {
            pTVar11 = sqlite3LocateTableItem(pParse,0,pSVar31);
            pSVar31->pTab = pTVar11;
            if (pTVar11 != (Table *)0x0) {
              if (pTVar11->nRef != 0xffff) {
                pTVar11->nRef = pTVar11->nRef + 1;
                if ((pTVar11->pSelect != (Select *)0x0) || ((pTVar11->tabFlags & 0x10) != 0)) {
                  iVar9 = sqlite3ViewGetColumnNames(pParse,pTVar11);
                  if (iVar9 != 0) goto LAB_0015b62c;
                  pSVar12 = sqlite3SelectDup(db,pTVar11->pSelect,0);
                  pSVar31->pSelect = pSVar12;
                  sqlite3WalkSelect(pWalker,pSVar12);
                }
LAB_0015b671:
                iVar9 = sqlite3IndexedByLookup(pParse,pSVar31);
                bVar38 = iVar9 == 0;
                if (!bVar38) {
                  iVar10 = 2;
                }
                goto LAB_0015b68c;
              }
              sqlite3ErrorMsg(pParse,"too many references to \"%s\": max 65535",pTVar11->zName);
              pSVar31->pTab = (Table *)0x0;
            }
LAB_0015b62c:
            iVar10 = 2;
          }
          bVar38 = false;
        }
        else {
          iVar10 = 1;
          bVar38 = false;
        }
LAB_0015b68c:
        if (!bVar38) {
          return iVar10;
        }
        iVar32 = iVar32 + 1;
        pSVar31 = pSVar31 + 1;
      } while (iVar32 < pList->nSrc);
    }
    if (db->mallocFailed == '\0') {
      pSrc = p->pSrc;
      if (1 < pSrc->nSrc) {
        pSVar31 = pSrc->a;
        pSVar33 = pSrc + 1;
        ppWhere = &p->pWhere;
        ppTVar1 = &pSrc->a[0].pTab;
        lVar22 = 0;
        do {
          pTVar11 = (Table *)pSVar33->a[0].zAlias;
          bVar38 = false;
          if (pTVar11 != (Table *)0x0 && pSVar31->pTab != (Table *)0x0) {
            bVar4 = (byte)pSVar33->a[0].addrFillSub;
            uVar19 = (bVar4 & 0x20) >> 5;
            if ((bVar4 & 4) != 0) {
              lVar30._0_1_ = pSVar33->a[0].jointype;
              lVar30._1_1_ = pSVar33->a[0].field_0x39;
              lVar30._2_1_ = pSVar33->a[0].iSelectId;
              lVar30._3_1_ = pSVar33->a[0].field_0x3b;
              lVar30._4_4_ = pSVar33->a[0].iCursor;
              if ((lVar30 != 0) || (pSVar33->a[0].pOn != (Expr *)0x0)) {
                sqlite3ErrorMsg(pParse,"a NATURAL join may not have an ON or USING clause",0);
                bVar38 = true;
                goto LAB_0015b928;
              }
              if (0 < pTVar11->nCol) {
                lVar30 = 0;
                do {
                  pcVar25 = pTVar11->aCol[lVar30].zName;
                  uVar13 = 0;
                  ppTVar26 = ppTVar1;
                  do {
                    iVar10 = columnIndex(*ppTVar26,pcVar25);
                    if (-1 < iVar10) {
                      local_58 = uVar13 & 0xffffffff;
                      local_94 = iVar10;
                      break;
                    }
                    uVar13 = uVar13 + 1;
                    ppTVar26 = ppTVar26 + 0xd;
                  } while (lVar22 + 1U != uVar13);
                  if (-1 < iVar10) {
                    addWhereTerm(pParse,pSrc,(int)local_58,local_94,(int)lVar22 + 1,(int)lVar30,
                                 uVar19,ppWhere);
                  }
                  lVar30 = lVar30 + 1;
                } while (lVar30 < pTVar11->nCol);
              }
            }
            pEVar15 = *(Expr **)&pSVar33->a[0].jointype;
            if (pEVar15 != (Expr *)0x0) {
              if (pSVar33->a[0].pOn != (Expr *)0x0) {
                sqlite3ErrorMsg(pParse,"cannot have both ON and USING clauses in the same join");
                bVar38 = true;
                goto LAB_0015b928;
              }
              if ((bVar4 & 0x20) != 0) {
                setJoinExpr(pEVar15,pSVar33->a[0].regReturn);
              }
              pEVar15 = sqlite3ExprAnd(pParse->db,*ppWhere,*(Expr **)&pSVar33->a[0].jointype);
              *ppWhere = pEVar15;
              pSVar33->a[0].jointype = '\0';
              pSVar33->a[0].field_0x39 = 0;
              pSVar33->a[0].iSelectId = '\0';
              pSVar33->a[0].field_0x3b = 0;
              pSVar33->a[0].iCursor = 0;
            }
            pEVar15 = pSVar33->a[0].pOn;
            bVar38 = false;
            if ((pEVar15 != (Expr *)0x0) && (0 < (pEVar15->u).iValue)) {
              lVar30 = 0;
              do {
                pcVar25 = *(char **)(*(long *)pEVar15 + lVar30 * 0x10);
                iVar10 = columnIndex(pTVar11,pcVar25);
                if (iVar10 < 0) {
LAB_0015b8fb:
                  sqlite3ErrorMsg(pParse,
                                  "cannot join using column %s - column not present in both tables",
                                  pcVar25);
                  bVar38 = true;
                  goto LAB_0015b928;
                }
                lVar35 = 0;
                ppTVar26 = ppTVar1;
                do {
                  iVar32 = columnIndex(*ppTVar26,pcVar25);
                  if (-1 < iVar32) {
                    local_cc = (int)lVar35;
                    local_b0._0_4_ = iVar32;
                    break;
                  }
                  lVar35 = lVar35 + 1;
                  ppTVar26 = ppTVar26 + 0xd;
                } while (lVar22 + 1 != lVar35);
                if (iVar32 < 0) goto LAB_0015b8fb;
                addWhereTerm(pParse,pSrc,local_cc,(int)local_b0,(int)lVar22 + 1,iVar10,uVar19,
                             ppWhere);
                lVar30 = lVar30 + 1;
              } while (lVar30 < (pEVar15->u).iValue);
              bVar38 = false;
            }
          }
LAB_0015b928:
          if (bVar38) {
            return 2;
          }
          lVar22 = lVar22 + 1;
          pSVar33 = (SrcList *)&pSVar33->a[0].pIndex;
          pSVar31 = pSVar31 + 1;
        } while (lVar22 < (long)pSrc->nSrc + -1);
      }
      uVar13 = (ulong)pList_00->nExpr;
      bVar38 = 0 < (long)uVar13;
      if (0 < (long)uVar13) {
        pEVar23 = pList_00->a;
        uVar14 = 1;
        do {
          uVar3 = pEVar23->pExpr->op;
          if (uVar3 == 'v') {
            uVar3 = pEVar23->pExpr->pRight->op;
          }
          if (uVar3 == 'q') {
            if (bVar38) {
              if (pList_00->nExpr < 1) {
                local_e0 = (ExprList *)0x0;
                goto LAB_0015bff5;
              }
              pEVar23 = pList_00->a;
              local_c8 = pParse->db->flags & 0xc;
              lVar22 = 0;
              local_e0 = (ExprList *)0x0;
              goto LAB_0015bab8;
            }
            break;
          }
          bVar38 = uVar14 < uVar13;
          pEVar23 = pEVar23 + 1;
          bVar37 = uVar14 != uVar13;
          uVar14 = uVar14 + 1;
        } while (bVar37);
      }
      goto LAB_0015c012;
    }
  }
  return 2;
LAB_0015bab8:
  do {
    pEVar15 = pEVar23[lVar22].pExpr;
    if (pEVar15->op == 'q') {
      zTab = (byte *)0x0;
LAB_0015bb43:
      if (pList->nSrc < 1) {
        bVar38 = true;
      }
      else {
        lVar30 = 0;
        lVar35 = -0x68;
        bVar38 = false;
        pSVar31 = pList->a;
        do {
          local_b0 = (byte *)pSVar31->zAlias;
          pTVar11 = pSVar31->pTab;
          if (local_b0 == (byte *)0x0) {
            local_b0 = (byte *)pTVar11->zName;
          }
          uVar3 = db->mallocFailed;
          if (uVar3 == '\0') {
            pSVar12 = pSVar31->pSelect;
            if ((pSVar12 == (Select *)0x0) || ((pSVar12->selFlags & 0x200) == 0)) {
              if (zTab != (byte *)0x0) {
                bVar4 = *zTab;
                pbVar24 = zTab;
                pbVar20 = local_b0;
                while ((bVar4 != 0 && (pbVar24 = pbVar24 + 1, ""[bVar4] == ""[*pbVar20]))) {
                  pbVar20 = pbVar20 + 1;
                  bVar4 = *pbVar24;
                }
                if (""[bVar4] != ""[*pbVar20]) goto LAB_0015bf56;
              }
              if (pTVar11->pSchema == (Schema *)0x0) {
                uVar13 = 0xfff0bdc0;
              }
              else {
                uVar19 = db->nDb;
                if ((int)uVar19 < 1) {
                  uVar13 = 0;
                }
                else {
                  ppSVar29 = &db->aDb->pSchema;
                  uVar14 = 0;
                  do {
                    uVar13 = uVar14;
                    if (*ppSVar29 == pTVar11->pSchema) break;
                    uVar14 = uVar14 + 1;
                    ppSVar29 = ppSVar29 + 4;
                    uVar13 = (ulong)uVar19;
                  } while (uVar19 != uVar14);
                }
              }
              if ((int)uVar13 < 0) {
                pSVar12 = (Select *)0x0;
                pcVar25 = "*";
              }
              else {
                pcVar25 = db->aDb[uVar13 & 0xffffffff].zName;
                pSVar12 = (Select *)0x0;
              }
            }
            else {
              pcVar25 = (char *)0x0;
            }
            if (0 < pTVar11->nCol) {
              lVar34 = 0;
              do {
                pCVar8 = pTVar11->aCol;
                pcVar18 = pCVar8[lVar34].zName;
                if (((pSVar12 == (Select *)0x0 || zTab == (byte *)0x0) ||
                    (iVar10 = sqlite3MatchSpanName
                                        (pSVar12->pEList->a[lVar34].zSpan,(char *)0x0,(char *)zTab,
                                         (char *)0x0), iVar10 != 0)) &&
                   ((pCVar8[lVar34].colFlags & 2) == 0)) {
                  if (lVar30 != 0 && zTab == (byte *)0x0) {
                    if ((pSVar31->jointype & 4) != 0) {
                      lVar28 = 0;
                      do {
                        iVar10 = columnIndex(*(Table **)((long)&pList->a[0].pTab + lVar28),pcVar18);
                        if (-1 < iVar10) break;
                        bVar38 = lVar35 != lVar28;
                        lVar28 = lVar28 + 0x68;
                      } while (bVar38);
                      bVar38 = true;
                      if (-1 < iVar10) goto LAB_0015bf45;
                    }
                    iVar10 = sqlite3IdListIndex(pSVar31->pUsing,pcVar18);
                    bVar38 = true;
                    if (-1 < iVar10) goto LAB_0015bf45;
                  }
                  pEVar15 = sqlite3Expr(db,0x1a,pcVar18);
                  if ((local_c8 == 4) || (1 < pList->nSrc)) {
                    pEVar16 = sqlite3Expr(db,0x1a,(char *)local_b0);
                    pEVar15 = sqlite3PExpr(pParse,0x76,pEVar16,pEVar15,(Token *)0x0);
                    if (pcVar25 != (char *)0x0) {
                      uVar19 = 0xffffffff;
                      pcVar17 = pcVar25;
                      do {
                        uVar19 = uVar19 + 1;
                        cVar5 = *pcVar17;
                        pcVar17 = pcVar17 + 1;
                      } while (cVar5 != '\0');
                      sColname.n = uVar19 & 0x3fffffff;
                      sColname.z = pcVar25;
                      pEVar16 = sqlite3ExprAlloc(db,0x1a,&sColname,0);
                      pEVar15 = sqlite3PExpr(pParse,0x76,pEVar16,pEVar15,(Token *)0x0);
                    }
                    if (local_c8 != 4) goto LAB_0015be5a;
                    pcVar17 = sqlite3MPrintf(db,"%s.%s",local_b0);
                    pcVar18 = pcVar17;
                  }
                  else {
LAB_0015be5a:
                    pcVar17 = (char *)0x0;
                  }
                  local_e0 = sqlite3ExprListAppend(pParse,local_e0,pEVar15);
                  if (pcVar18 == (char *)0x0) {
                    sColname.n = 0;
                  }
                  else {
                    uVar19 = 0xffffffff;
                    pcVar21 = pcVar18;
                    do {
                      uVar19 = uVar19 + 1;
                      cVar5 = *pcVar21;
                      pcVar21 = pcVar21 + 1;
                    } while (cVar5 != '\0');
                    sColname.n = uVar19 & 0x3fffffff;
                  }
                  sColname.z = pcVar18;
                  sqlite3ExprListSetName(pParse,local_e0,&sColname,0);
                  if ((local_e0 != (ExprList *)0x0) && ((p->selFlags & 0x200) != 0)) {
                    iVar10 = local_e0->nExpr;
                    pEVar27 = local_e0->a;
                    if (pSVar12 == (Select *)0x0) {
                      pcVar18 = sqlite3MPrintf(db,"%s.%s.%s",pcVar25);
                    }
                    else {
                      pcVar18 = sqlite3DbStrDup(db,pSVar12->pEList->a[lVar34].zSpan);
                    }
                    pEVar27[(long)iVar10 + -1].zSpan = pcVar18;
                    puVar2 = &pEVar27[(long)iVar10 + -1].field_0x19;
                    *puVar2 = *puVar2 | 2;
                  }
                  sqlite3DbFree(db,pcVar17);
                  bVar38 = true;
                }
LAB_0015bf45:
                lVar34 = lVar34 + 1;
              } while (lVar34 < pTVar11->nCol);
            }
          }
LAB_0015bf56:
          if (uVar3 != '\0') break;
          lVar30 = lVar30 + 1;
          pSVar31 = pSVar31 + 1;
          lVar35 = lVar35 + 0x68;
        } while (lVar30 < pList->nSrc);
        bVar38 = !bVar38;
      }
      if (bVar38) {
        if (zTab == (byte *)0x0) {
          sqlite3ErrorMsg(pParse,"no tables specified");
        }
        else {
          sqlite3ErrorMsg(pParse,"no such table: %s");
        }
      }
    }
    else {
      if ((pEVar15->op == 'v') && (pEVar15->pRight->op == 'q')) {
        zTab = (byte *)(pEVar15->pLeft->u).zToken;
        goto LAB_0015bb43;
      }
      pEVar27 = pEVar23 + lVar22;
      local_e0 = sqlite3ExprListAppend(pParse,local_e0,pEVar15);
      if (local_e0 != (ExprList *)0x0) {
        pEVar7 = local_e0->a;
        iVar10 = local_e0->nExpr;
        pEVar7[(long)iVar10 + -1].zName = pEVar27->zName;
        pEVar7[(long)iVar10 + -1].zSpan = pEVar27->zSpan;
        pEVar27->zName = (char *)0x0;
        pEVar27->zSpan = (char *)0x0;
      }
      pEVar27->pExpr = (Expr *)0x0;
    }
    lVar22 = lVar22 + 1;
  } while (lVar22 < pList_00->nExpr);
LAB_0015bff5:
  sqlite3ExprListDelete(db,pList_00);
  p->pEList = local_e0;
LAB_0015c012:
  if ((p->pEList != (ExprList *)0x0) && (db->aLimit[2] < p->pEList->nExpr)) {
    sqlite3ErrorMsg(pParse,"too many columns in result set");
  }
  return 0;
}

Assistant:

static int selectExpander(Walker *pWalker, Select *p){
  Parse *pParse = pWalker->pParse;
  int i, j, k;
  SrcList *pTabList;
  ExprList *pEList;
  struct SrcList_item *pFrom;
  sqlite3 *db = pParse->db;
  Expr *pE, *pRight, *pExpr;
  u16 selFlags = p->selFlags;

  p->selFlags |= SF_Expanded;
  if( db->mallocFailed  ){
    return WRC_Abort;
  }
  if( NEVER(p->pSrc==0) || (selFlags & SF_Expanded)!=0 ){
    return WRC_Prune;
  }
  pTabList = p->pSrc;
  pEList = p->pEList;

  /* Make sure cursor numbers have been assigned to all entries in
  ** the FROM clause of the SELECT statement.
  */
  sqlite3SrcListAssignCursors(pParse, pTabList);

  /* Look up every table named in the FROM clause of the select.  If
  ** an entry of the FROM clause is a subquery instead of a table or view,
  ** then create a transient table structure to describe the subquery.
  */
  for(i=0, pFrom=pTabList->a; i<pTabList->nSrc; i++, pFrom++){
    Table *pTab;
    if( pFrom->pTab!=0 ){
      /* This statement has already been prepared.  There is no need
      ** to go further. */
      assert( i==0 );
      return WRC_Prune;
    }
    if( pFrom->zName==0 ){
#ifndef SQLITE_OMIT_SUBQUERY
      Select *pSel = pFrom->pSelect;
      /* A sub-query in the FROM clause of a SELECT */
      assert( pSel!=0 );
      assert( pFrom->pTab==0 );
      sqlite3WalkSelect(pWalker, pSel);
      pFrom->pTab = pTab = sqlite3DbMallocZero(db, sizeof(Table));
      if( pTab==0 ) return WRC_Abort;
      pTab->nRef = 1;
      pTab->zName = sqlite3MPrintf(db, "sqlite_subquery_%p_", (void*)pTab);
      while( pSel->pPrior ){ pSel = pSel->pPrior; }
      selectColumnsFromExprList(pParse, pSel->pEList, &pTab->nCol, &pTab->aCol);
      pTab->iPKey = -1;
      pTab->nRowEst = 1000000;
      pTab->tabFlags |= TF_Ephemeral;
#endif
    }else{
      /* An ordinary table or view name in the FROM clause */
      assert( pFrom->pTab==0 );
      pFrom->pTab = pTab = sqlite3LocateTableItem(pParse, 0, pFrom);
      if( pTab==0 ) return WRC_Abort;
      if( pTab->nRef==0xffff ){
        sqlite3ErrorMsg(pParse, "too many references to \"%s\": max 65535",
           pTab->zName);
        pFrom->pTab = 0;
        return WRC_Abort;
      }
      pTab->nRef++;
#if !defined(SQLITE_OMIT_VIEW) || !defined (SQLITE_OMIT_VIRTUALTABLE)
      if( pTab->pSelect || IsVirtual(pTab) ){
        /* We reach here if the named table is a really a view */
        if( sqlite3ViewGetColumnNames(pParse, pTab) ) return WRC_Abort;
        assert( pFrom->pSelect==0 );
        pFrom->pSelect = sqlite3SelectDup(db, pTab->pSelect, 0);
        sqlite3WalkSelect(pWalker, pFrom->pSelect);
      }
#endif
    }

    /* Locate the index named by the INDEXED BY clause, if any. */
    if( sqlite3IndexedByLookup(pParse, pFrom) ){
      return WRC_Abort;
    }
  }

  /* Process NATURAL keywords, and ON and USING clauses of joins.
  */
  if( db->mallocFailed || sqliteProcessJoin(pParse, p) ){
    return WRC_Abort;
  }

  /* For every "*" that occurs in the column list, insert the names of
  ** all columns in all tables.  And for every TABLE.* insert the names
  ** of all columns in TABLE.  The parser inserted a special expression
  ** with the TK_ALL operator for each "*" that it found in the column list.
  ** The following code just has to locate the TK_ALL expressions and expand
  ** each one to the list of all columns in all tables.
  **
  ** The first loop just checks to see if there are any "*" operators
  ** that need expanding.
  */
  for(k=0; k<pEList->nExpr; k++){
    pE = pEList->a[k].pExpr;
    if( pE->op==TK_ALL ) break;
    assert( pE->op!=TK_DOT || pE->pRight!=0 );
    assert( pE->op!=TK_DOT || (pE->pLeft!=0 && pE->pLeft->op==TK_ID) );
    if( pE->op==TK_DOT && pE->pRight->op==TK_ALL ) break;
  }
  if( k<pEList->nExpr ){
    /*
    ** If we get here it means the result set contains one or more "*"
    ** operators that need to be expanded.  Loop through each expression
    ** in the result set and expand them one by one.
    */
    struct ExprList_item *a = pEList->a;
    ExprList *pNew = 0;
    int flags = pParse->db->flags;
    int longNames = (flags & SQLITE_FullColNames)!=0
                      && (flags & SQLITE_ShortColNames)==0;

    /* When processing FROM-clause subqueries, it is always the case
    ** that full_column_names=OFF and short_column_names=ON.  The
    ** sqlite3ResultSetOfSelect() routine makes it so. */
    assert( (p->selFlags & SF_NestedFrom)==0
          || ((flags & SQLITE_FullColNames)==0 &&
              (flags & SQLITE_ShortColNames)!=0) );

    for(k=0; k<pEList->nExpr; k++){
      pE = a[k].pExpr;
      pRight = pE->pRight;
      assert( pE->op!=TK_DOT || pRight!=0 );
      if( pE->op!=TK_ALL && (pE->op!=TK_DOT || pRight->op!=TK_ALL) ){
        /* This particular expression does not need to be expanded.
        */
        pNew = sqlite3ExprListAppend(pParse, pNew, a[k].pExpr);
        if( pNew ){
          pNew->a[pNew->nExpr-1].zName = a[k].zName;
          pNew->a[pNew->nExpr-1].zSpan = a[k].zSpan;
          a[k].zName = 0;
          a[k].zSpan = 0;
        }
        a[k].pExpr = 0;
      }else{
        /* This expression is a "*" or a "TABLE.*" and needs to be
        ** expanded. */
        int tableSeen = 0;      /* Set to 1 when TABLE matches */
        char *zTName = 0;       /* text of name of TABLE */
        if( pE->op==TK_DOT ){
          assert( pE->pLeft!=0 );
          assert( !ExprHasProperty(pE->pLeft, EP_IntValue) );
          zTName = pE->pLeft->u.zToken;
        }
        for(i=0, pFrom=pTabList->a; i<pTabList->nSrc; i++, pFrom++){
          Table *pTab = pFrom->pTab;
          Select *pSub = pFrom->pSelect;
          char *zTabName = pFrom->zAlias;
          const char *zSchemaName = 0;
          int iDb;
          if( zTabName==0 ){
            zTabName = pTab->zName;
          }
          if( db->mallocFailed ) break;
          if( pSub==0 || (pSub->selFlags & SF_NestedFrom)==0 ){
            pSub = 0;
            if( zTName && sqlite3StrICmp(zTName, zTabName)!=0 ){
              continue;
            }
            iDb = sqlite3SchemaToIndex(db, pTab->pSchema);
            zSchemaName = iDb>=0 ? db->aDb[iDb].zName : "*";
          }
          for(j=0; j<pTab->nCol; j++){
            char *zName = pTab->aCol[j].zName;
            char *zColname;  /* The computed column name */
            char *zToFree;   /* Malloced string that needs to be freed */
            Token sColname;  /* Computed column name as a token */

            assert( zName );
            if( zTName && pSub
             && sqlite3MatchSpanName(pSub->pEList->a[j].zSpan, 0, zTName, 0)==0
            ){
              continue;
            }

            /* If a column is marked as 'hidden' (currently only possible
            ** for virtual tables), do not include it in the expanded
            ** result-set list.
            */
            if( IsHiddenColumn(&pTab->aCol[j]) ){
              assert(IsVirtual(pTab));
              continue;
            }
            tableSeen = 1;

            if( i>0 && zTName==0 ){
              if( (pFrom->jointype & JT_NATURAL)!=0
                && tableAndColumnIndex(pTabList, i, zName, 0, 0)
              ){
                /* In a NATURAL join, omit the join columns from the 
                ** table to the right of the join */
                continue;
              }
              if( sqlite3IdListIndex(pFrom->pUsing, zName)>=0 ){
                /* In a join with a USING clause, omit columns in the
                ** using clause from the table on the right. */
                continue;
              }
            }
            pRight = sqlite3Expr(db, TK_ID, zName);
            zColname = zName;
            zToFree = 0;
            if( longNames || pTabList->nSrc>1 ){
              Expr *pLeft;
              pLeft = sqlite3Expr(db, TK_ID, zTabName);
              pExpr = sqlite3PExpr(pParse, TK_DOT, pLeft, pRight, 0);
              if( zSchemaName ){
                pLeft = sqlite3Expr(db, TK_ID, zSchemaName);
                pExpr = sqlite3PExpr(pParse, TK_DOT, pLeft, pExpr, 0);
              }
              if( longNames ){
                zColname = sqlite3MPrintf(db, "%s.%s", zTabName, zName);
                zToFree = zColname;
              }
            }else{
              pExpr = pRight;
            }
            pNew = sqlite3ExprListAppend(pParse, pNew, pExpr);
            sColname.z = zColname;
            sColname.n = sqlite3Strlen30(zColname);
            sqlite3ExprListSetName(pParse, pNew, &sColname, 0);
            if( pNew && (p->selFlags & SF_NestedFrom)!=0 ){
              struct ExprList_item *pX = &pNew->a[pNew->nExpr-1];
              if( pSub ){
                pX->zSpan = sqlite3DbStrDup(db, pSub->pEList->a[j].zSpan);
                testcase( pX->zSpan==0 );
              }else{
                pX->zSpan = sqlite3MPrintf(db, "%s.%s.%s",
                                           zSchemaName, zTabName, zColname);
                testcase( pX->zSpan==0 );
              }
              pX->bSpanIsTab = 1;
            }
            sqlite3DbFree(db, zToFree);
          }
        }
        if( !tableSeen ){
          if( zTName ){
            sqlite3ErrorMsg(pParse, "no such table: %s", zTName);
          }else{
            sqlite3ErrorMsg(pParse, "no tables specified");
          }
        }
      }
    }
    sqlite3ExprListDelete(db, pEList);
    p->pEList = pNew;
  }
#if SQLITE_MAX_COLUMN
  if( p->pEList && p->pEList->nExpr>db->aLimit[SQLITE_LIMIT_COLUMN] ){
    sqlite3ErrorMsg(pParse, "too many columns in result set");
  }
#endif
  return WRC_Continue;
}